

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseRAPass::_markStackArgsToKeep(BaseRAPass *this)

{
  uint uVar1;
  FuncNode *pFVar2;
  RAWorkReg *pRVar3;
  long lVar4;
  RAWorkReg **ppRVar5;
  FuncValue *pFVar6;
  size_t i;
  bool bVar7;
  
  pFVar2 = this->_func;
  bVar7 = true;
  if (((pFVar2->_frame)._attributes & kHasPreservedFP) == kNoAttributes) {
    bVar7 = (pFVar2->_frame)._finalStackAlignment < (pFVar2->_frame)._minDynamicAlignment;
  }
  uVar1 = *(uint *)&this->field_0x148;
  i = 0;
  do {
    if (uVar1 == i) {
      return 0;
    }
    ppRVar5 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[](&this->_workRegs,i);
    pRVar3 = *ppRVar5;
    if (((byte)pRVar3[0x25] & 4) != 0) {
      if ((ulong)(byte)pRVar3[0x48] == 0xff) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/rapass.cpp"
                   ,0x705,"workReg->hasArgIndex()");
      }
      pFVar6 = FuncDetail::arg(&this->_func->_funcDetail,(ulong)(byte)pRVar3[0x48],0);
      lVar4 = *(long *)(pRVar3 + 0x18);
      if (lVar4 == 0) {
        return 3;
      }
      if (((bVar7) && ((pFVar6->_data & 0x600) == 0x200)) &&
         (*(uint *)(lVar4 + 4) ==
          (uint)(byte)TypeUtils::_typeData[(ulong)(pFVar6->_data & 0xff) + 0x100])) {
        *(byte *)(lVar4 + 2) = *(byte *)(lVar4 + 2) | 2;
      }
      else {
        pFVar6 = FuncArgsAssignment::arg
                           (&this->_argsAssignment,(ulong)(byte)pRVar3[0x48],
                            (ulong)(byte)pRVar3[0x49]);
        FuncValue::assignStackOffset(pFVar6,0);
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

Error BaseRAPass::_markStackArgsToKeep() noexcept {
  FuncFrame& frame = func()->frame();
  bool hasSAReg = frame.hasPreservedFP() || !frame.hasDynamicAlignment();

  RAWorkRegs& workRegs = _workRegs;
  uint32_t numWorkRegs = workRegCount();

  for (uint32_t workId = 0; workId < numWorkRegs; workId++) {
    RAWorkReg* workReg = workRegs[workId];
    if (workReg->hasFlag(RAWorkRegFlags::kStackArgToStack)) {
      ASMJIT_ASSERT(workReg->hasArgIndex());
      const FuncValue& srcArg = _func->detail().arg(workReg->argIndex());

      // If the register doesn't have stack slot then we failed. It doesn't make much sense as it was marked as
      // `kFlagStackArgToStack`, which requires the WorkReg was live-in upon function entry.
      RAStackSlot* slot = workReg->stackSlot();
      if (ASMJIT_UNLIKELY(!slot))
        return DebugUtils::errored(kErrorInvalidState);

      if (hasSAReg && srcArg.isStack() && !srcArg.isIndirect()) {
        uint32_t typeSize = TypeUtils::sizeOf(srcArg.typeId());
        if (typeSize == slot->size()) {
          slot->addFlags(RAStackSlot::kFlagStackArg);
          continue;
        }
      }

      // NOTE: Update StackOffset here so when `_argsAssignment.updateFuncFrame()` is called it will take into
      // consideration moving to stack slots. Without this we may miss some scratch registers later.
      FuncValue& dstArg = _argsAssignment.arg(workReg->argIndex(), workReg->argValueIndex());
      dstArg.assignStackOffset(0);
    }
  }

  return kErrorOk;
}